

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O3

void __thiscall xe::ContainerFormatParser::parseContainerLine(ContainerFormatParser *this)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uchar *puVar4;
  bool bVar5;
  ContainerElement CVar6;
  int iVar7;
  uint uVar8;
  undefined8 extraout_RAX;
  ContainerFormatParser *pCVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int local_54;
  undefined1 local_50 [32];
  
  iVar13 = (this->m_buf).m_numElements;
  iVar10 = this->m_elementLen;
  if (iVar13 <= this->m_elementLen) {
    iVar10 = iVar13;
  }
  puVar4 = (this->m_buf).m_buffer;
  iVar7 = (this->m_buf).m_back;
  iVar3 = (this->m_buf).m_size;
  iVar12 = 1;
  if (1 < iVar10) {
    iVar12 = iVar10;
  }
  lVar14 = 0;
  do {
    uVar11 = 0;
    while (iVar12 + -1 != (int)uVar11) {
      bVar1 = puVar4[(iVar7 + 1 + (int)uVar11) % iVar3];
      if (((ulong)bVar1 < 0x21) && ((0x100002401U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
      goto LAB_00114714;
      cVar2 = parseContainerLine::s_elements[lVar14].name[uVar11];
      if ((cVar2 == '\0') || (uVar11 = uVar11 + 1, (uint)bVar1 != (int)cVar2)) goto LAB_00114721;
    }
    uVar11 = (ulong)(iVar12 - 1);
LAB_00114714:
    if (parseContainerLine::s_elements[lVar14].name[(int)uVar11] == '\0') {
      CVar6 = parseContainerLine::s_elements[lVar14].element;
      this->m_element = CVar6;
      iVar10 = (int)uVar11 + 1;
      goto LAB_0011473c;
    }
LAB_00114721:
    lVar14 = lVar14 + 1;
  } while (lVar14 != 6);
  CVar6 = this->m_element;
  iVar10 = 1;
LAB_0011473c:
  if (CVar6 < CONTAINERELEMENT_TEST_LOG_DATA) {
    if ((0x4cU >> (CVar6 & 0x1f) & 1) != 0) {
      return;
    }
    if ((0xa0U >> (CVar6 & 0x1f) & 1) == 0) {
      if (CVar6 != CONTAINERELEMENT_SESSION_INFO) goto LAB_0011482f;
      if ((iVar13 <= iVar10) || (puVar4[(iVar7 + iVar10) % iVar3] != ' ')) goto LAB_001148d2;
      local_54 = iVar10 + 1;
      parseContainerValue(this,&this->m_attribute,&local_54);
      iVar13 = local_54;
      if (((this->m_buf).m_numElements <= local_54) ||
         ((this->m_buf).m_buffer[((this->m_buf).m_back + local_54) % (this->m_buf).m_size] != ' '))
      goto LAB_001148fd;
      iVar10 = local_54 + 1;
      local_54 = iVar10;
      iVar7 = std::__cxx11::string::compare((char *)&this->m_attribute);
      if (iVar7 == 0) {
        (this->m_value)._M_string_length = 0;
        *(this->m_value)._M_dataplus._M_p = '\0';
        if (this->m_elementLen <= iVar10) {
          return;
        }
        if ((this->m_buf).m_numElements <= iVar10) {
          return;
        }
        iVar13 = iVar13 + 2;
        do {
          uVar8 = (uint)(this->m_buf).m_buffer
                        [((this->m_buf).m_back + iVar13 + -1) % (this->m_buf).m_size];
          if ((uVar8 < 0xb) && ((0x601U >> (uVar8 & 0x1f) & 1) != 0)) {
            return;
          }
          std::__cxx11::string::push_back((char)this + '0');
          if (this->m_elementLen <= iVar13) {
            return;
          }
          bVar5 = iVar13 < (this->m_buf).m_numElements;
          iVar13 = iVar13 + 1;
        } while (bVar5);
        return;
      }
    }
    else {
      if ((iVar13 <= iVar10) || (puVar4[(iVar7 + iVar10) % iVar3] != ' ')) {
        local_50._0_8_ = local_50 + 0x10;
        pCVar9 = (ContainerFormatParser *)local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pCVar9,"Expected value after instruction","");
        error(pCVar9,(string *)local_50);
LAB_001148d2:
        local_50._0_8_ = local_50 + 0x10;
        pCVar9 = (ContainerFormatParser *)local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pCVar9,"Expected attribute name after #sessionInfo","");
        error(pCVar9,(string *)local_50);
LAB_001148fd:
        pCVar9 = (ContainerFormatParser *)local_50;
        local_50._0_8_ = local_50 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pCVar9,"No value for #sessionInfo attribute","");
        error(pCVar9,(string *)local_50);
        if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
          operator_delete((void *)local_50._0_8_,(ulong)(local_50._16_8_ + 1));
        }
        _Unwind_Resume(extraout_RAX);
      }
      local_54 = iVar10 + 1;
    }
    parseContainerValue(this,&this->m_value,&local_54);
  }
  else {
LAB_0011482f:
    this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
  }
  return;
}

Assistant:

void ContainerFormatParser::parseContainerLine (void)
{
	static const struct
	{
		const char*			name;
		ContainerElement	element;
	} s_elements[] =
	{
		{ "beginTestCaseResult",		CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT		},
		{ "endTestCaseResult",			CONTAINERELEMENT_END_TEST_CASE_RESULT		},
		{ "terminateTestCaseResult",	CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT	},
		{ "sessionInfo",				CONTAINERELEMENT_SESSION_INFO				},
		{ "beginSession",				CONTAINERELEMENT_BEGIN_SESSION				},
		{ "endSession",					CONTAINERELEMENT_END_SESSION				}
	};

	DE_ASSERT(m_elementLen >= 1);
	DE_ASSERT(getChar(0) == '#');

	int offset = 1;

	for (int elemNdx = 0; elemNdx < DE_LENGTH_OF_ARRAY(s_elements); elemNdx++)
	{
		bool	isMatch	= false;
		int		ndx		= 0;

		for (;;)
		{
			int		bufChar		= (offset+ndx < m_elementLen) ? getChar(offset+ndx) : 0;
			bool	bufEnd		= bufChar == 0 || bufChar == ' ' || bufChar == '\r' || bufChar == '\n' || bufChar == (int)END_OF_BUFFER;
			int		elemChar	= s_elements[elemNdx].name[ndx];
			bool	elemEnd		= elemChar == 0;

			if (bufEnd || elemEnd)
			{
				isMatch = bufEnd == elemEnd;
				break;
			}
			else if (bufChar != elemChar)
				break;

			ndx += 1;
		}

		if (isMatch)
		{
			m_element	 = s_elements[elemNdx].element;
			offset		+= ndx;
			break;
		}
	}

	switch (m_element)
	{
		case CONTAINERELEMENT_BEGIN_SESSION:
		case CONTAINERELEMENT_END_SESSION:
		case CONTAINERELEMENT_END_TEST_CASE_RESULT:
			break; // No attribute or value.

		case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
		case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
			if (getChar(offset) != ' ')
				error("Expected value after instruction");
			offset += 1;
			parseContainerValue(m_value, offset);
			break;

		case CONTAINERELEMENT_SESSION_INFO:
			if (getChar(offset) != ' ')
				error("Expected attribute name after #sessionInfo");
			offset += 1;
			parseContainerValue(m_attribute, offset);
			if (getChar(offset) != ' ')
				error("No value for #sessionInfo attribute");
			offset += 1;

			if (m_attribute == "timestamp")
			{
				m_value.clear();

				// \note Candy produces unescaped timestamps.
				for (;;)
				{
					const int	curChar	= offset < m_elementLen ? getChar(offset) : 0;
					const bool	isEnd	= curChar == 0 || curChar == (int)END_OF_BUFFER || curChar == '\n' || curChar == '\t';

					if (isEnd)
						break;
					else
						m_value.push_back((char)curChar);

					offset += 1;
				}
			}
			else
				parseContainerValue(m_value, offset);
			break;

		default:
			// \todo [2012-06-09 pyry] Implement better way to handle # at the beginning of log lines.
			m_element = CONTAINERELEMENT_TEST_LOG_DATA;
			break;
	}
}